

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O2

OLECHAR * Js::CharClassifier::SkipWhiteSpaceSurrogateStartEnd
                    (LPCOLESTR pStr,LPCOLESTR pStrEnd,CharClassifier *instance)

{
  OLECHAR *pOVar1;
  OLECHAR OVar2;
  bool bVar3;
  codepoint_t ch;
  long lVar4;
  
  do {
    if (pStrEnd <= pStr) {
      return pStr;
    }
    OVar2 = *pStr;
    if (OVar2 == L'\0') {
      return pStr;
    }
    bVar3 = IsWhiteSpace(instance,(uint)(ushort)OVar2);
    lVar4 = 2;
    if (!bVar3) {
      bVar3 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar2);
      if (!bVar3) {
        return pStr;
      }
      pOVar1 = pStr + 1;
      if (pStrEnd <= pOVar1) {
        return pStr;
      }
      bVar3 = NumberUtilities::IsSurrogateUpperPart((uint)(ushort)*pOVar1);
      if (!bVar3) {
        return pStr;
      }
      ch = NumberUtilities::SurrogatePairAsCodePoint((uint)(ushort)OVar2,(uint)(ushort)*pOVar1);
      bVar3 = IsWhiteSpace(instance,ch);
      lVar4 = 4;
      if (!bVar3) {
        return pStr;
      }
    }
    pStr = (LPCOLESTR)((long)pStr + lVar4);
  } while( true );
}

Assistant:

const OLECHAR* Js::CharClassifier::SkipWhiteSpaceSurrogateStartEnd(_In_reads_(pStrEnd - pStr) LPCOLESTR pStr, _In_ LPCOLESTR pStrEnd, const CharClassifier *instance)
{
    char16 currentChar = 0x0;

    // Same reasoning as above
    while(pStr < pStrEnd && (currentChar = *pStr) != '\0')
    {
        if (!instance->IsWhiteSpace(currentChar))
        {
            if (Js::NumberUtilities::IsSurrogateLowerPart(currentChar) && (pStr + 1) < pStrEnd && Js::NumberUtilities::IsSurrogateUpperPart(*(pStr + 1)))
            {
                if (instance->IsWhiteSpace(Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, *(pStr + 1))))
                {
                    pStr += 2;
                    continue;
                }
            }

            // Above case failed, so we have reached the last whitespace
            return pStr;
        }

        pStr++;
    }

    return pStr;
}